

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Command.cpp
# Opt level: O2

int __thiscall IRCCommand::getAccessLevel(IRCCommand *this,Channel *channel)

{
  int iVar1;
  pointer pCVar2;
  pointer pTVar3;
  bool bVar4;
  int iVar5;
  char *in_RCX;
  pointer this_00;
  pointer pTVar6;
  int *piVar7;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  undefined1 auVar8 [16];
  
  pCVar2 = (this->m_channels).
           super__Vector_base<IRCCommand::ChannelAccessPair,_std::allocator<IRCCommand::ChannelAccessPair>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_channels).
                 super__Vector_base<IRCCommand::ChannelAccessPair,_std::allocator<IRCCommand::ChannelAccessPair>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pCVar2; this_00 = this_00 + 1
      ) {
    auVar8 = Jupiter::IRC::Client::Channel::getName();
    rhs._M_len = auVar8._8_8_;
    rhs._M_str = in_RCX;
    bVar4 = jessilib::equalsi<char,char>((jessilib *)this_00,auVar8._0_8_,rhs);
    if (bVar4) {
      piVar7 = &this_00->access;
      goto LAB_00110390;
    }
  }
  pTVar6 = (this->m_types).
           super__Vector_base<IRCCommand::TypeAccessPair,_std::allocator<IRCCommand::TypeAccessPair>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar3 = (this->m_types).
           super__Vector_base<IRCCommand::TypeAccessPair,_std::allocator<IRCCommand::TypeAccessPair>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pTVar6 == pTVar3) {
      piVar7 = &this->m_access;
LAB_00110390:
      return *piVar7;
    }
    iVar1 = pTVar6->type;
    iVar5 = Jupiter::IRC::Client::Channel::getType();
    if (iVar1 == iVar5) {
      piVar7 = &pTVar6->access;
      goto LAB_00110390;
    }
    pTVar6 = pTVar6 + 1;
  } while( true );
}

Assistant:

int IRCCommand::getAccessLevel(Jupiter::IRC::Client::Channel *channel) {
	for (const auto& pair : m_channels) {
		if (jessilib::equalsi(pair.channel, channel->getName())) {
			return pair.access;
		}
	}

	for (const auto& pair : m_types) {
		if (pair.type == channel->getType()) {
			return pair.access;
		}
	}

	return m_access;
}